

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::merge_sort
          (Suffix_Array<unsigned_long> *this,idx_t_conflict *X,idx_t_conflict *Y,idx_t_conflict n,
          idx_t_conflict *LCP,idx_t_conflict *W)

{
  idx_t_conflict *in_RCX;
  idx_t_conflict *X_00;
  idx_t_conflict *in_RDX;
  idx_t_conflict *in_RSI;
  undefined8 *in_R8;
  Suffix_Array<unsigned_long> *in_R9;
  anon_class_56_7_61fff2ed g;
  anon_class_48_6_ea688d0d f;
  idx_t_conflict m;
  anon_class_56_7_61fff2ed *in_stack_ffffffffffffff38;
  anon_class_48_6_ea688d0d *in_stack_ffffffffffffff40;
  idx_t_conflict *LCP_x;
  undefined1 *len_y;
  idx_t_conflict *Y_00;
  undefined1 *len_x;
  undefined1 local_28 [8];
  
  if (in_RCX == (idx_t_conflict *)0x1) {
    *in_R8 = 0;
  }
  else {
    X_00 = (idx_t_conflict *)((ulong)in_RCX >> 1);
    LCP_x = (idx_t_conflict *)&stack0xfffffffffffffff0;
    len_y = &stack0xffffffffffffffc8;
    Y_00 = (idx_t_conflict *)&stack0xffffffffffffffd0;
    len_x = local_28;
    if (X_00 < (idx_t_conflict *)0x2000) {
      merge_sort::anon_class_48_6_ea688d0d::operator()((anon_class_48_6_ea688d0d *)0x10e762);
      merge_sort::anon_class_56_7_61fff2ed::operator()((anon_class_56_7_61fff2ed *)0x10e76c);
    }
    else {
      parlay::
      par_do<CaPS_SA::Suffix_Array<unsigned_long>::merge_sort(unsigned_long*,unsigned_long*,unsigned_long,unsigned_long*,unsigned_long*)const::_lambda()_1_const&,CaPS_SA::Suffix_Array<unsigned_long>::merge_sort(unsigned_long*,unsigned_long*,unsigned_long,unsigned_long*,unsigned_long*)const::_lambda()_2_const&>
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,false);
    }
    merge(in_R9,X_00,(idx_t_conflict)len_x,Y_00,(idx_t_conflict)len_y,LCP_x,in_RCX,in_RDX,in_RSI);
  }
  return;
}

Assistant:

void Suffix_Array<T_idx_>::merge_sort(idx_t* const X, idx_t* const Y, const idx_t n, idx_t* const LCP, idx_t* const W) const
{
    assert(std::memcmp(X, Y, n * sizeof(idx_t)) == 0);

    if(n == 1)
        LCP[0] = 0;
    else
    {
        const idx_t m = n / 2;
        const auto f = [&](){ merge_sort(Y, X, m, W, LCP); };
        const auto g = [&](){ merge_sort(Y + m, X + m, n - m, W + m, LCP + m); };

        m < nested_par_grain_size ?
            (f(), g()) : parlay::par_do(f, g);
        merge(X, m, X + m, n - m, W, W + m, Y, LCP);
    }
}